

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QRhiGles2::Scratch::SeparateSampler>::
emplace_back_impl<QRhiGles2::Scratch::SeparateSampler>
          (QVLABase<QRhiGles2::Scratch::SeparateSampler> *this,qsizetype prealloc,void *array,
          SeparateSampler *args)

{
  QVLABase<QRhiGles2::Scratch::SeparateSampler> *this_00;
  QVLABase<QRhiGles2::Scratch::SeparateSampler> *pQVar1;
  iterator ptr;
  SeparateSampler *pSVar2;
  SeparateSampler *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<QRhiGles2::Scratch::SeparateSampler> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<QRhiGles2::Scratch::SeparateSampler> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<QRhiGles2::Scratch::SeparateSampler> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX)
    ;
  }
  ptr = end(this_00);
  pSVar2 = q20::
           construct_at<QRhiGles2::Scratch::SeparateSampler,QRhiGles2::Scratch::SeparateSampler,void>
                     (ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return pSVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }